

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check_run.c
# Opt level: O2

TestResult * tcase_run_tfun_nofork(SRunner *sr,TCase *tc,TF *tfun,int i)

{
  TTest *pTVar1;
  clockid_t cVar2;
  int iVar3;
  TestResult *pTVar4;
  timespec ts_start;
  timespec ts_end;
  timespec local_48;
  timespec local_38;
  
  local_48.tv_sec = 0;
  local_48.tv_nsec = 0;
  local_38.tv_sec = 0;
  local_38.tv_nsec = 0;
  pTVar4 = tcase_run_checked_setup(sr,tc);
  if (pTVar4 == (TestResult *)0x0) {
    cVar2 = check_get_clockid();
    clock_gettime(cVar2,&local_48);
    iVar3 = _setjmp((__jmp_buf_tag *)error_jmp_buffer);
    if (iVar3 == 0) {
      pTVar1 = tfun->ttest;
      tcase_fn_start(pTVar1->name,pTVar1->file,pTVar1->line);
      (*tfun->ttest->fn)(i);
    }
    cVar2 = check_get_clockid();
    clock_gettime(cVar2,&local_38);
    tcase_run_checked_teardown(tc);
    pTVar4 = receive_result_info_nofork
                       (tc->name,tfun->ttest->name,i,
                        ((int)local_38.tv_sec - (int)local_48.tv_sec) * 1000000 +
                        (int)(local_38.tv_nsec / 1000) + (int)(local_48.tv_nsec / -1000));
  }
  return pTVar4;
}

Assistant:

static TestResult *tcase_run_tfun_nofork(SRunner * sr, TCase * tc, TF * tfun,
                                         int i)
{
    TestResult *tr;
    struct timespec ts_start = {0, 0}, ts_end = {0, 0};

    tr = tcase_run_checked_setup(sr, tc);
    if(tr == NULL)
    {
        clock_gettime(check_get_clockid(), &ts_start);
        if(0 == setjmp(error_jmp_buffer))
        {
            tcase_fn_start(tfun->ttest->name, tfun->ttest->file, tfun->ttest->line);
            tfun->ttest->fn(i);
        }
        clock_gettime(check_get_clockid(), &ts_end);
        tcase_run_checked_teardown(tc);
        return receive_result_info_nofork(tc->name, tfun->ttest->name, i,
                                          DIFF_IN_USEC(ts_start, ts_end));
    }

    return tr;
}